

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O2

void Ivy_NodeComputeVolume2(Ivy_Obj_t *pObj,int nNodeLimit,Vec_Ptr_t *vNodes,Vec_Ptr_t *vFront)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar6;
  void *Entry;
  uint uVar7;
  ulong uVar5;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x11a,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  vNodes->nSize = 0;
  vFront->nSize = 0;
  pObj->field_0x8 = pObj->field_0x8 | 0x10;
  Vec_PtrPush(vNodes,pObj);
  Vec_PtrPush(vFront,pObj);
  uVar7 = *(uint *)&pObj->field_0x8 >> 0xb;
  do {
    iVar6 = vFront->nSize;
    do {
      if (iVar6 < 1) {
        uVar7 = uVar7 - 1;
        if (uVar7 != 0) goto LAB_005ea3ee;
        uVar2 = vNodes->nSize;
        goto LAB_005ea3fe;
      }
      iVar6 = iVar6 + -1;
      pvVar3 = Vec_PtrEntry(vFront,iVar6);
    } while (*(uint *)((long)pvVar3 + 8) >> 0xb != uVar7);
    uVar2 = vFront->nSize;
    uVar4 = (ulong)uVar2;
    do {
      if ((int)uVar4 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      uVar5 = uVar4 - 1;
      lVar1 = uVar4 - 1;
      uVar4 = uVar5;
    } while (vFront->pArray[lVar1] != pvVar3);
    while (uVar4 = uVar5 + 1, (int)uVar4 < (int)uVar2) {
      vFront->pArray[uVar5] = vFront->pArray[uVar4];
      uVar5 = uVar4;
    }
    vFront->nSize = uVar2 - 1;
    Entry = (void *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe);
    if ((*(uint *)((long)Entry + 8) & 0x10) == 0) {
      *(uint *)((long)Entry + 8) = *(uint *)((long)Entry + 8) | 0x10;
      Vec_PtrPush(vNodes,Entry);
      Vec_PtrPush(vFront,Entry);
    }
    pvVar3 = (void *)(*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe);
    if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 8) & 0x10) == 0)) {
      *(uint *)((long)pvVar3 + 8) = *(uint *)((long)pvVar3 + 8) | 0x10;
      Vec_PtrPush(vNodes,pvVar3);
      Vec_PtrPush(vFront,pvVar3);
    }
LAB_005ea3ee:
    uVar2 = vNodes->nSize;
  } while ((int)uVar2 < nNodeLimit);
LAB_005ea3fe:
  if (1 < (int)uVar2) {
    qsort(vNodes->pArray,(ulong)uVar2,8,Ivy_CompareNodesByLevel);
  }
  pvVar3 = Vec_PtrEntry(vNodes,0);
  uVar4 = (ulong)vNodes->nSize;
  if ((long)uVar4 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  if (*(uint *)((long)vNodes->pArray[uVar4 - 1] + 8) >> 0xb < *(uint *)((long)pvVar3 + 8) >> 0xb) {
    __assert_fail("pFanin->Level <= pPivot->Level",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x150,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (iVar6 = 0; iVar6 < (int)uVar4; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(vNodes,iVar6);
    *(byte *)((long)pvVar3 + 8) = *(byte *)((long)pvVar3 + 8) & 0xef;
    *(int *)((long)pvVar3 + 4) = iVar6;
    uVar4 = (ulong)(uint)vNodes->nSize;
  }
  return;
}

Assistant:

void Ivy_NodeComputeVolume2( Ivy_Obj_t * pObj, int nNodeLimit, Vec_Ptr_t * vNodes, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pLeaf, * pPivot, * pFanin;
    int LevelMax, i;
    assert( Ivy_ObjIsNode(pObj) );
    // clear arrays
    Vec_PtrClear( vNodes );
    Vec_PtrClear( vFront );
    // add the root
    pObj->fMarkA = 1;
    Vec_PtrPush( vNodes, pObj );
    Vec_PtrPush( vFront, pObj );
    // expand node with maximum level
    LevelMax = pObj->Level;
    do {
        // get the node to expand
        pPivot = NULL;
        Vec_PtrForEachEntryReverse( Ivy_Obj_t *, vFront, pLeaf, i )
        {
            if ( (int)pLeaf->Level == LevelMax )
            {
                pPivot = pLeaf;
                break;
            }
        }
        // decrease level if we did not find the node
        if ( pPivot == NULL )
        {
            if ( --LevelMax == 0 )
                break;
            continue;
        }
        // the node to expand is found
        // remove it from frontier
        Vec_PtrRemove( vFront, pPivot );
        // add fanins
        pFanin = Ivy_ObjFanin0(pPivot); 
        if ( !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        pFanin = Ivy_ObjFanin1(pPivot); 
        if ( pFanin && !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        // quit if we collected enough nodes
    } while ( Vec_PtrSize(vNodes) < nNodeLimit );

    // sort nodes by level
    Vec_PtrSort( vNodes, (int (*)(void))Ivy_CompareNodesByLevel );
    // make sure the nodes are ordered in the increasing number of levels
    pFanin = (Ivy_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    pPivot = (Ivy_Obj_t *)Vec_PtrEntryLast( vNodes );
    assert( pFanin->Level <= pPivot->Level );

    // clean the marks and remember node numbers in the TravId
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pFanin, i )
    {
        pFanin->fMarkA = 0;
        pFanin->TravId = i;
    }
}